

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::StringSplitRegexFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  scalar_function_t *psVar1;
  LogicalType varargs;
  _Any_data *p_Var2;
  long lVar3;
  bind_scalar_function_t *pp_Var4;
  ScalarFunctionSet *in_RDI;
  bind_scalar_function_t *pp_Var5;
  LogicalType *other;
  byte bVar6;
  initializer_list<duckdb::LogicalType> __l;
  FunctionNullHandling in_stack_fffffffffffffb88;
  bind_lambda_function_t in_stack_fffffffffffffb90;
  scalar_function_t local_460;
  _Any_data *local_440;
  LogicalType local_438;
  vector<duckdb::LogicalType,_true> local_420;
  LogicalType varchar_list_type;
  LogicalType local_3f0;
  LogicalType local_3d8 [2];
  ScalarFunction regex_fun;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  bVar6 = 0;
  LogicalType::LogicalType((LogicalType *)&regex_fun,VARCHAR);
  LogicalType::LIST(&varchar_list_type,(LogicalType *)&regex_fun);
  LogicalType::~LogicalType((LogicalType *)&regex_fun);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  LogicalType::LogicalType(local_3d8,VARCHAR);
  LogicalType::LogicalType(local_3d8 + 1,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_3d8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_420,__l,
             (allocator_type *)&stack0xfffffffffffffb97);
  LogicalType::LogicalType(&local_438,&varchar_list_type);
  local_460.super__Function_base._M_functor._8_8_ = 0;
  local_460.super__Function_base._M_functor._M_unused._M_object = StringSplitRegexFunction;
  local_460._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_460.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_3f0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  varargs._0_8_ = &local_3f0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001;
  ScalarFunction::ScalarFunction
            (&regex_fun,&local_420,&local_438,&local_460,RegexpMatchesBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,RegexInitLocalState,
             varargs,CONSISTENT,in_stack_fffffffffffffb88,in_stack_fffffffffffffb90);
  LogicalType::~LogicalType(&local_3f0);
  if (local_460.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_460.super__Function_base._M_manager)
              ((_Any_data *)&local_460,(_Any_data *)&local_460,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_438);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_420);
  lVar3 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_3d8[0].id_ + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_280,(SimpleFunction *)&regex_fun);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  other = &regex_fun.super_BaseScalarFunction.return_type;
  LogicalType::LogicalType(&local_280.super_BaseScalarFunction.return_type,other);
  local_280.super_BaseScalarFunction.stability = regex_fun.super_BaseScalarFunction.stability;
  local_280.super_BaseScalarFunction.null_handling =
       regex_fun.super_BaseScalarFunction.null_handling;
  local_280.super_BaseScalarFunction.errors = regex_fun.super_BaseScalarFunction.errors;
  local_280.super_BaseScalarFunction.collation_handling =
       regex_fun.super_BaseScalarFunction.collation_handling;
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  psVar1 = &local_280.function;
  local_440 = (_Any_data *)&regex_fun.function;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_440);
  pp_Var4 = &regex_fun.bind;
  pp_Var5 = &local_280.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = *pp_Var4;
    pp_Var4 = pp_Var4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_280.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (regex_fun.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (regex_fun.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (regex_fun.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_280);
  local_280.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
             &regex_fun.super_BaseScalarFunction.super_SimpleFunction.arguments,
             &LogicalType::VARCHAR);
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_158,(SimpleFunction *)&regex_fun);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::LogicalType(&local_158.super_BaseScalarFunction.return_type,other);
  p_Var2 = local_440;
  psVar1 = &local_158.function;
  local_158.super_BaseScalarFunction.stability = regex_fun.super_BaseScalarFunction.stability;
  local_158.super_BaseScalarFunction.null_handling =
       regex_fun.super_BaseScalarFunction.null_handling;
  local_158.super_BaseScalarFunction.errors = regex_fun.super_BaseScalarFunction.errors;
  local_158.super_BaseScalarFunction.collation_handling =
       regex_fun.super_BaseScalarFunction.collation_handling;
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (psVar1,(function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                     *)local_440);
  pp_Var4 = &regex_fun.bind;
  pp_Var5 = &local_158.bind;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pp_Var5 = *pp_Var4;
    pp_Var4 = pp_Var4 + (ulong)bVar6 * -2 + 1;
    pp_Var5 = pp_Var5 + (ulong)bVar6 * -2 + 1;
  }
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_158.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (regex_fun.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (regex_fun.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (regex_fun.function_info.internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (regex_fun.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_158);
  local_158.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)psVar1,(_Any_data *)psVar1,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  regex_fun.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (regex_fun.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (regex_fun.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (regex_fun.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*regex_fun.function.super__Function_base._M_manager)(p_Var2,p_Var2,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&regex_fun.super_BaseScalarFunction);
  LogicalType::~LogicalType(&varchar_list_type);
  return in_RDI;
}

Assistant:

ScalarFunctionSet StringSplitRegexFun::GetFunctions() {
	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	ScalarFunctionSet regexp_split;
	ScalarFunction regex_fun({LogicalType::VARCHAR, LogicalType::VARCHAR}, varchar_list_type, StringSplitRegexFunction,
	                         RegexpMatchesBind, nullptr, nullptr, RegexInitLocalState, LogicalType::INVALID,
	                         FunctionStability::CONSISTENT, FunctionNullHandling::SPECIAL_HANDLING);
	regexp_split.AddFunction(regex_fun);
	// regexp options
	regex_fun.arguments.emplace_back(LogicalType::VARCHAR);
	regexp_split.AddFunction(regex_fun);
	return regexp_split;
}